

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

int __thiscall cmake::AddCMakePaths(cmake *this)

{
  bool bVar1;
  string *psVar2;
  allocator<char> local_101;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  cmake *local_18;
  cmake *this_local;
  
  local_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"CMAKE_COMMAND",&local_39);
  psVar2 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  AddCacheEntry(this,&local_38,psVar2,"Path to CMake executable.",4);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"CMAKE_CTEST_COMMAND",&local_71);
  psVar2 = cmSystemTools::GetCTestCommand_abi_cxx11_();
  AddCacheEntry(this,&local_70,psVar2,"Path to ctest program executable.",4);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"CMAKE_CPACK_COMMAND",&local_99);
  psVar2 = cmSystemTools::GetCPackCommand_abi_cxx11_();
  AddCacheEntry(this,&local_98,psVar2,"Path to cpack program executable.",4);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  psVar2 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
  std::operator+(&local_c0,psVar2,"/Modules/CMake.cmake");
  bVar1 = cmsys::SystemTools::FileExists(&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
  if (bVar1) {
    psVar2 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
    std::operator+(&local_e0,
                   "Could not find CMAKE_ROOT !!!\nCMake has most likely not been installed correctly.\nModules directory not found in\n"
                   ,psVar2);
    cmSystemTools::Error(&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"CMAKE_ROOT",&local_101)
    ;
    psVar2 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
    AddCacheEntry(this,&local_100,psVar2,"Path to CMake installation.",4);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator(&local_101);
  }
  this_local._4_4_ = (uint)!bVar1;
  return this_local._4_4_;
}

Assistant:

int cmake::AddCMakePaths()
{
  // Save the value in the cache
  this->AddCacheEntry("CMAKE_COMMAND", cmSystemTools::GetCMakeCommand(),
                      "Path to CMake executable.", cmStateEnums::INTERNAL);
#ifndef CMAKE_BOOTSTRAP
  this->AddCacheEntry("CMAKE_CTEST_COMMAND", cmSystemTools::GetCTestCommand(),
                      "Path to ctest program executable.",
                      cmStateEnums::INTERNAL);
  this->AddCacheEntry("CMAKE_CPACK_COMMAND", cmSystemTools::GetCPackCommand(),
                      "Path to cpack program executable.",
                      cmStateEnums::INTERNAL);
#endif
  if (!cmSystemTools::FileExists(
        (cmSystemTools::GetCMakeRoot() + "/Modules/CMake.cmake"))) {
    // couldn't find modules
    cmSystemTools::Error(
      "Could not find CMAKE_ROOT !!!\n"
      "CMake has most likely not been installed correctly.\n"
      "Modules directory not found in\n" +
      cmSystemTools::GetCMakeRoot());
    return 0;
  }
  this->AddCacheEntry("CMAKE_ROOT", cmSystemTools::GetCMakeRoot(),
                      "Path to CMake installation.", cmStateEnums::INTERNAL);

  return 1;
}